

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

uint8_t * __thiscall
google::protobuf::ExtensionRangeOptions_Declaration::_InternalSerialize
          (ExtensionRangeOptions_Declaration *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  ExtensionRangeOptions_Declaration *pEVar1;
  bool bVar2;
  int32_t value;
  int iVar3;
  uint32_t *puVar4;
  char *pcVar5;
  UnknownFieldSet *unknown_fields;
  string_view sVar6;
  string_view local_70;
  string *local_60;
  string *_s_1;
  char *local_50;
  string_view local_48;
  string *local_38;
  string *_s;
  ExtensionRangeOptions_Declaration *pEStack_28;
  uint32_t cached_has_bits;
  ExtensionRangeOptions_Declaration *this_;
  EpsCopyOutputStream *stream_local;
  uint8_t *target_local;
  ExtensionRangeOptions_Declaration *this_local;
  
  _s._4_4_ = 0;
  pEStack_28 = this;
  this_ = (ExtensionRangeOptions_Declaration *)stream;
  stream_local = (EpsCopyOutputStream *)target;
  target_local = (uint8_t *)this;
  puVar4 = internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  pEVar1 = this_;
  _s._4_4_ = *puVar4;
  if ((_s._4_4_ & 4) != 0) {
    value = _internal_number(pEStack_28);
    stream_local = (EpsCopyOutputStream *)
                   internal::WireFormatLite::WriteInt32ToArrayWithField<1>
                             ((EpsCopyOutputStream *)pEVar1,value,(uint8_t *)stream_local);
  }
  if ((_s._4_4_ & 1) != 0) {
    local_38 = _internal_full_name_abi_cxx11_(pEStack_28);
    pcVar5 = (char *)std::__cxx11::string::data();
    iVar3 = std::__cxx11::string::length();
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_48,"google.protobuf.ExtensionRangeOptions.Declaration.full_name");
    internal::WireFormat::VerifyUTF8StringNamedField(pcVar5,iVar3,SERIALIZE,local_48);
    pEVar1 = this_;
    sVar6 = (string_view)
            std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_38);
    local_50 = sVar6._M_str;
    _s_1 = (string *)sVar6._M_len;
    stream_local = (EpsCopyOutputStream *)
                   protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                             ((EpsCopyOutputStream *)pEVar1,2,sVar6,(uint8_t *)stream_local);
  }
  if ((_s._4_4_ & 2) != 0) {
    local_60 = _internal_type_abi_cxx11_(pEStack_28);
    pcVar5 = (char *)std::__cxx11::string::data();
    iVar3 = std::__cxx11::string::length();
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_70,"google.protobuf.ExtensionRangeOptions.Declaration.type");
    internal::WireFormat::VerifyUTF8StringNamedField(pcVar5,iVar3,SERIALIZE,local_70);
    pEVar1 = this_;
    sVar6 = (string_view)
            std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_60);
    stream_local = (EpsCopyOutputStream *)
                   protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                             ((EpsCopyOutputStream *)pEVar1,3,sVar6,(uint8_t *)stream_local);
  }
  if ((_s._4_4_ & 8) != 0) {
    stream_local = (EpsCopyOutputStream *)
                   protobuf::io::EpsCopyOutputStream::EnsureSpace
                             ((EpsCopyOutputStream *)this_,(uint8_t *)stream_local);
    bVar2 = _internal_reserved(pEStack_28);
    stream_local = (EpsCopyOutputStream *)
                   internal::WireFormatLite::WriteBoolToArray(5,bVar2,(uint8_t *)stream_local);
  }
  if ((_s._4_4_ & 0x10) != 0) {
    stream_local = (EpsCopyOutputStream *)
                   protobuf::io::EpsCopyOutputStream::EnsureSpace
                             ((EpsCopyOutputStream *)this_,(uint8_t *)stream_local);
    bVar2 = _internal_repeated(pEStack_28);
    stream_local = (EpsCopyOutputStream *)
                   internal::WireFormatLite::WriteBoolToArray(6,bVar2,(uint8_t *)stream_local);
  }
  bVar2 = internal::InternalMetadata::have_unknown_fields
                    (&(pEStack_28->super_Message).super_MessageLite._internal_metadata_);
  if (bVar2) {
    unknown_fields =
         internal::InternalMetadata::unknown_fields<google::protobuf::UnknownFieldSet>
                   (&(pEStack_28->super_Message).super_MessageLite._internal_metadata_,
                    UnknownFieldSet::default_instance);
    stream_local = (EpsCopyOutputStream *)
                   internal::WireFormat::InternalSerializeUnknownFieldsToArray
                             (unknown_fields,(uint8_t *)stream_local,(EpsCopyOutputStream *)this_);
  }
  return (uint8_t *)stream_local;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL ExtensionRangeOptions_Declaration::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const ExtensionRangeOptions_Declaration& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.ExtensionRangeOptions.Declaration)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  cached_has_bits = this_._impl_._has_bits_[0];
  // optional int32 number = 1;
  if ((cached_has_bits & 0x00000004u) != 0) {
    target =
        ::google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<1>(
            stream, this_._internal_number(), target);
  }

  // optional string full_name = 2;
  if ((cached_has_bits & 0x00000001u) != 0) {
    const ::std::string& _s = this_._internal_full_name();
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(_s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormat::SERIALIZE,
                                "google.protobuf.ExtensionRangeOptions.Declaration.full_name");
    target = stream->WriteStringMaybeAliased(2, _s, target);
  }

  // optional string type = 3;
  if ((cached_has_bits & 0x00000002u) != 0) {
    const ::std::string& _s = this_._internal_type();
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(_s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormat::SERIALIZE,
                                "google.protobuf.ExtensionRangeOptions.Declaration.type");
    target = stream->WriteStringMaybeAliased(3, _s, target);
  }

  // optional bool reserved = 5;
  if ((cached_has_bits & 0x00000008u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteBoolToArray(
        5, this_._internal_reserved(), target);
  }

  // optional bool repeated = 6;
  if ((cached_has_bits & 0x00000010u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteBoolToArray(
        6, this_._internal_repeated(), target);
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.ExtensionRangeOptions.Declaration)
  return target;
}